

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  TokenType TVar1;
  TokenType TVar2;
  Result RVar3;
  Script *script;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_b0 [32];
  undefined1 *local_90 [2];
  undefined1 local_80 [32];
  Script *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  undefined8 uStack_40;
  _Head_base<0UL,_wabt::ModuleCommand_*,_false> local_38;
  
  script = (Script *)operator_new(0x50);
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  *(undefined8 *)
   &(script->module_bindings).
    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
    ._M_h._M_rehash_policy = 0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (script->commands).
  super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_buckets =
       &(script->module_bindings).
        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ._M_h._M_single_bucket;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_bucket_count = 1;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_element_count = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (script->module_bindings).
  super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60 = script;
  TVar1 = Peek(this,0);
  TVar2 = Peek(this,1);
  if (((TVar1 == Lpar) && (TVar2 < First_Literal)) &&
     ((0x2c008dd800U >> ((ulong)TVar2 & 0x3f) & 1) != 0)) {
    MakeUnique<wabt::ModuleCommand>();
    GetToken((Token *)local_b0,this);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b0._16_8_;
    uStack_40 = local_b0._24_8_;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b0._0_8_;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b0._8_8_;
    Token::~Token((Token *)local_b0);
    ((local_38._M_head_impl)->module).loc.field_1.field_1.offset =
         (size_t)local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&((local_38._M_head_impl)->module).loc.field_1 + 8) = uStack_40;
    ((local_38._M_head_impl)->module).loc.filename.data_ =
         (char *)local_58.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    ((local_38._M_head_impl)->module).loc.filename.size_ =
         (size_type)
         local_58.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    RVar3 = ParseModuleFieldList(this,&(local_38._M_head_impl)->module);
    if (RVar3.enum_ != Error) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)script,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &local_38);
    }
    if (local_38._M_head_impl != (ModuleCommand *)0x0) {
      (*((local_38._M_head_impl)->super_CommandMixin<(wabt::CommandType)0>).super_Command.
        _vptr_Command[1])();
    }
joined_r0x00f5a342:
    if (RVar3.enum_ == Error) goto LAB_00f5a414;
  }
  else {
    TVar1 = Peek(this,0);
    TVar2 = Peek(this,1);
    if (((TVar1 == Lpar) && (TVar2 < Result)) && ((0x411203fcU >> (TVar2 & Result) & 1) != 0)) {
      RVar3 = ParseCommandList(this,script,(CommandPtrVector *)script);
      goto joined_r0x00f5a342;
    }
    Match(this,Lpar);
    local_b0._0_8_ = local_b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a module field","");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a command","");
    __l._M_len = 2;
    __l._M_array = (iterator)local_b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_58,__l,(allocator_type *)&local_38);
    ErrorExpected(this,&local_58,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    lVar4 = 0;
    do {
      if (local_80 + lVar4 != *(undefined1 **)((long)local_90 + lVar4)) {
        operator_delete(*(undefined1 **)((long)local_90 + lVar4));
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x40);
  }
  RVar3 = Expect(this,Eof);
  if ((RVar3.enum_ != Error) &&
     ((this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->errors_->super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>)._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               script);
    return (Result)Ok;
  }
LAB_00f5a414:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 *)&script->module_bindings);
  std::
  vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
  ::~vector((vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             *)script);
  operator_delete(script);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = MakeUnique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair())) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = MakeUnique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (errors_->size() == 0) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}